

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Path * __thiscall kj::Path::append(Path *__return_storage_ptr__,Path *this,Path *suffix)

{
  size_t sVar1;
  String *pSVar2;
  long lVar3;
  String *pSVar4;
  long lVar5;
  Array<kj::String> *__range1_1;
  Array<kj::String> *__range1;
  ArrayBuilder<kj::String> local_58;
  Array<kj::String> result;
  
  pSVar2 = _::HeapArrayDisposer::allocateUninitialized<kj::String>
                     ((suffix->parts).size_ + (this->parts).size_);
  local_58.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pSVar4 = (this->parts).ptr;
  sVar1 = (this->parts).size_;
  for (lVar3 = 0; sVar1 * 0x18 - lVar3 != 0; lVar3 = lVar3 + 0x18) {
    *(char **)((long)&(pSVar2->content).ptr + lVar3) = (pSVar4->content).ptr;
    *(size_t *)((long)&(pSVar2->content).size_ + lVar3) = (pSVar4->content).size_;
    *(ArrayDisposer **)((long)&(pSVar2->content).disposer + lVar3) = (pSVar4->content).disposer;
    (pSVar4->content).ptr = (char *)0x0;
    (pSVar4->content).size_ = 0;
    pSVar4 = pSVar4 + 1;
  }
  pSVar4 = (suffix->parts).ptr;
  for (lVar5 = (suffix->parts).size_ * 0x18; lVar5 != 0; lVar5 = lVar5 + -0x18) {
    *(char **)((long)&(pSVar2->content).ptr + lVar3) = (pSVar4->content).ptr;
    *(size_t *)((long)&(pSVar2->content).size_ + lVar3) = (pSVar4->content).size_;
    *(ArrayDisposer **)((long)&(pSVar2->content).disposer + lVar3) = (pSVar4->content).disposer;
    (pSVar4->content).ptr = (char *)0x0;
    (pSVar4->content).size_ = 0;
    pSVar4 = pSVar4 + 1;
    lVar3 = lVar3 + 0x18;
  }
  result.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_58.ptr = (String *)0x0;
  local_58.pos = (RemoveConst<kj::String> *)0x0;
  local_58.endPtr = (String *)0x0;
  (__return_storage_ptr__->parts).ptr = pSVar2;
  (__return_storage_ptr__->parts).size_ = lVar3 / 0x18;
  (__return_storage_ptr__->parts).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  result.ptr = (String *)0x0;
  result.size_ = 0;
  Array<kj::String>::~Array(&result);
  ArrayBuilder<kj::String>::dispose(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Path Path::append(Path&& suffix) && {
  auto newParts = kj::heapArrayBuilder<String>(parts.size() + suffix.parts.size());
  for (auto& p: parts) newParts.add(kj::mv(p));
  for (auto& p: suffix.parts) newParts.add(kj::mv(p));
  return Path(newParts.finish(), ALREADY_CHECKED);
}